

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

bool __thiscall args::Group::Matched(Group *this)

{
  bool bVar1;
  Group *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  
  bVar1 = std::function<bool_(const_args::Group_&)>::operator()
                    ((function<bool_(const_args::Group_&)> *)
                     CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
                     in_stack_ffffffffffffffe8);
  return bVar1;
}

Assistant:

virtual bool Matched() const noexcept override
            {
                return validator(*this);
            }